

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrShareSpacesRecipientBaseHeaderMETA *value)

{
  bool bVar1;
  XrResult XVar2;
  allocator local_81;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_80;
  string local_68;
  string error_str;
  
  if (value->type != XR_TYPE_SHARE_SPACES_RECIPIENT_GROUPS_META) {
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrShareSpacesRecipientBaseHeaderMETA",
               value->type,"VUID-XrShareSpacesRecipientBaseHeaderMETA-type-type",XR_TYPE_UNKNOWN,"")
    ;
    return XR_ERROR_VALIDATION_FAILURE;
  }
  if ((instance_info != (GenValidUsageXrInstanceInfo *)0x0) &&
     (bVar1 = ExtensionEnabled(&instance_info->enabled_extensions,
                               "XR_META_spatial_entity_group_sharing"), !bVar1)) {
    std::__cxx11::string::string
              ((string *)&error_str,
               "XrShareSpacesRecipientBaseHeaderMETA being used with child struct type ",
               (allocator *)&local_68);
    std::__cxx11::string::append((char *)&error_str);
    std::__cxx11::string::append((char *)&error_str);
    std::__cxx11::string::string
              ((string *)&local_68,"VUID-XrShareSpacesRecipientBaseHeaderMETA-type-type",&local_81);
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_80,objects_info);
    CoreValidLogMessage(instance_info,&local_68,VALID_USAGE_DEBUG_SEVERITY_ERROR,command_name,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_80,&error_str);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_80);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&error_str);
    return XR_ERROR_VALIDATION_FAILURE;
  }
  XVar2 = ValidateXrStruct(instance_info,command_name,objects_info,check_members,false,
                           (XrShareSpacesRecipientGroupsMETA *)value);
  return XVar2;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrShareSpacesRecipientBaseHeaderMETA* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // NOTE: Can't validate "VUID-XrShareSpacesRecipientBaseHeaderMETA-type-parameter" because it is a base structure
    // NOTE: Can't validate "VUID-XrShareSpacesRecipientBaseHeaderMETA-next-next" because it is a base structure
    if (value->type == XR_TYPE_SHARE_SPACES_RECIPIENT_GROUPS_META) {
        const XrShareSpacesRecipientGroupsMETA* new_value = reinterpret_cast<const XrShareSpacesRecipientGroupsMETA*>(value);
        if (nullptr != instance_info && !ExtensionEnabled(instance_info->enabled_extensions, "XR_META_spatial_entity_group_sharing")) {
            std::string error_str = "XrShareSpacesRecipientBaseHeaderMETA being used with child struct type ";
            error_str += "\"XR_TYPE_SHARE_SPACES_RECIPIENT_GROUPS_META\"";
            error_str += " which requires extension \"XR_META_spatial_entity_group_sharing\" to be enabled, but it is not enabled";
            CoreValidLogMessage(instance_info, "VUID-XrShareSpacesRecipientBaseHeaderMETA-type-type",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, error_str);
            return XR_ERROR_VALIDATION_FAILURE;
        }
        return ValidateXrStruct(instance_info, command_name, objects_info, check_members, false, new_value);
    }
    InvalidStructureType(instance_info, command_name, objects_info, "XrShareSpacesRecipientBaseHeaderMETA",
                         value->type, "VUID-XrShareSpacesRecipientBaseHeaderMETA-type-type");
    return XR_ERROR_VALIDATION_FAILURE;
}